

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scriptpubkeyman.cpp
# Opt level: O0

bool __thiscall wallet::LegacyDataSPKM::HaveKey(LegacyDataSPKM *this,CKeyID *address)

{
  long lVar1;
  byte bVar2;
  size_type sVar3;
  CKeyID *in_RDI;
  long in_FS_OFFSET;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock32;
  AnnotatedMixin<std::recursive_mutex> *in_stack_ffffffffffffff88;
  key_type *in_stack_ffffffffffffff90;
  undefined7 in_stack_ffffffffffffff98;
  undefined1 in_stack_ffffffffffffff9f;
  undefined1 in_stack_ffffffffffffffab;
  int in_stack_ffffffffffffffac;
  undefined7 in_stack_ffffffffffffffb8;
  undefined1 in_stack_ffffffffffffffbf;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *in_stack_ffffffffffffffc8;
  bool local_19;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>(in_stack_ffffffffffffff88);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            (in_stack_ffffffffffffffc8,
             (AnnotatedMixin<std::recursive_mutex> *)
             CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
             (char *)CONCAT17(in_stack_ffffffffffffffbf,in_stack_ffffffffffffffb8),(char *)in_RDI,
             in_stack_ffffffffffffffac,(bool)in_stack_ffffffffffffffab);
  bVar2 = (**(code **)(**(long **)((in_RDI->super_uint160).super_base_blob<160U>.m_data._M_elems + 8
                                  ) + 0x48))();
  if ((bVar2 & 1) == 0) {
    local_19 = FillableSigningProvider::HaveKey
                         ((FillableSigningProvider *)CONCAT17(bVar2,in_stack_ffffffffffffffb8),
                          in_RDI);
  }
  else {
    sVar3 = std::
            map<CKeyID,_std::pair<CPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_std::pair<CPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>
            ::count((map<CKeyID,_std::pair<CPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_std::pair<CPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>
                     *)CONCAT17(in_stack_ffffffffffffff9f,in_stack_ffffffffffffff98),
                    in_stack_ffffffffffffff90);
    local_19 = sVar3 != 0;
  }
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::~UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)in_stack_ffffffffffffff88);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return local_19;
  }
  __stack_chk_fail();
}

Assistant:

bool LegacyDataSPKM::HaveKey(const CKeyID &address) const
{
    LOCK(cs_KeyStore);
    if (!m_storage.HasEncryptionKeys()) {
        return FillableSigningProvider::HaveKey(address);
    }
    return mapCryptedKeys.count(address) > 0;
}